

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  int iVar1;
  Parse *pPVar2;
  int *piVar3;
  int n;
  int *aLabel;
  Parse *pParse;
  Op *pOp;
  int nMaxArgs;
  int *pMaxFuncArgs_local;
  Vdbe *p_local;
  
  pOp._4_4_ = *pMaxFuncArgs;
  pPVar2 = p->pParse;
  piVar3 = pPVar2->aLabel;
  p->field_0xc6 = p->field_0xc6 & 0xbf | 0x40;
  p->field_0xc6 = p->field_0xc6 & 0x7f;
  pParse = (Parse *)(p->aOp + (p->nOp + -1));
  do {
    if (*(byte *)&pParse->db < 0x41) {
      switch(*(undefined1 *)&pParse->db) {
      case 2:
        if (*(int *)&pParse->zErrMsg != 0) {
          p->field_0xc6 = p->field_0xc6 & 0xbf;
        }
      case 0:
      case 1:
        p->field_0xc6 = p->field_0xc6 & 0x7f | 0x80;
        break;
      case 3:
      case 4:
      case 5:
        p->field_0xc6 = p->field_0xc6 & 0xbf;
        p->field_0xc6 = p->field_0xc6 & 0x7f | 0x80;
        break;
      case 6:
        iVar1 = *(int *)((long)&pParse[-1].apVtabLock + 4);
        if (pOp._4_4_ < iVar1) {
          pOp._4_4_ = iVar1;
        }
      default:
        if (*(int *)&pParse->zErrMsg < 0) {
          *(int *)&pParse->zErrMsg = piVar3[(int)(*(uint *)&pParse->zErrMsg ^ 0xffffffff)];
        }
        break;
      case 7:
        if (pOp._4_4_ < *(int *)&pParse->zErrMsg) {
          pOp._4_4_ = *(int *)&pParse->zErrMsg;
        }
      }
    }
    if (pParse == (Parse *)p->aOp) {
      if (piVar3 != (int *)0x0) {
        sqlite3DbFreeNN(p->db,pPVar2->aLabel);
        pPVar2->aLabel = (int *)0x0;
      }
      pPVar2->nLabel = 0;
      *pMaxFuncArgs = pOp._4_4_;
      return;
    }
    pParse = (Parse *)&pParse[-1].apVtabLock;
  } while( true );
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  Parse *pParse = p->pParse;
  int *aLabel = pParse->aLabel;
  p->readOnly = 1;
  p->bIsReader = 0;
  pOp = &p->aOp[p->nOp-1];
  while(1){

    /* Only JUMP opcodes and the short list of special opcodes in the switch
    ** below need to be considered.  The mkopcodeh.tcl generator script groups
    ** all these opcodes together near the front of the opcode list.  Skip
    ** any opcode that does not need processing by virtual of the fact that
    ** it is larger than SQLITE_MX_JUMP_OPCODE, as a performance optimization.
    */
    if( pOp->opcode<=SQLITE_MX_JUMP_OPCODE ){
      /* NOTE: Be sure to update mkopcodeh.tcl when adding or removing
      ** cases from this switch! */
      switch( pOp->opcode ){
        case OP_Transaction: {
          if( pOp->p2!=0 ) p->readOnly = 0;
          /* no break */ deliberate_fall_through
        }
        case OP_AutoCommit:
        case OP_Savepoint: {
          p->bIsReader = 1;
          break;
        }
#ifndef SQLITE_OMIT_WAL
        case OP_Checkpoint:
#endif
        case OP_Vacuum:
        case OP_JournalMode: {
          p->readOnly = 0;
          p->bIsReader = 1;
          break;
        }
#ifndef SQLITE_OMIT_VIRTUALTABLE
        case OP_VUpdate: {
          if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
          break;
        }
        case OP_VFilter: {
          int n;
          assert( (pOp - p->aOp) >= 3 );
          assert( pOp[-1].opcode==OP_Integer );
          n = pOp[-1].p1;
          if( n>nMaxArgs ) nMaxArgs = n;
          /* Fall through into the default case */
          /* no break */ deliberate_fall_through
        }
#endif
        default: {
          if( pOp->p2<0 ){
            /* The mkopcodeh.tcl script has so arranged things that the only
            ** non-jump opcodes less than SQLITE_MX_JUMP_CODE are guaranteed to
            ** have non-negative values for P2. */
            assert( (sqlite3OpcodeProperty[pOp->opcode] & OPFLG_JUMP)!=0 );
            assert( ADDR(pOp->p2)<-pParse->nLabel );
            pOp->p2 = aLabel[ADDR(pOp->p2)];
          }
          break;
        }
      }
      /* The mkopcodeh.tcl script has so arranged things that the only
      ** non-jump opcodes less than SQLITE_MX_JUMP_CODE are guaranteed to
      ** have non-negative values for P2. */
      assert( (sqlite3OpcodeProperty[pOp->opcode]&OPFLG_JUMP)==0 || pOp->p2>=0);
    }
    if( pOp==p->aOp ) break;
    pOp--;
  }
  if( aLabel ){
    sqlite3DbFreeNN(p->db, pParse->aLabel);
    pParse->aLabel = 0;
  }
  pParse->nLabel = 0;
  *pMaxFuncArgs = nMaxArgs;
  assert( p->bIsReader!=0 || DbMaskAllZero(p->btreeMask) );
}